

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::percolateUp(Heap<Gluco::Solver::VarOrderLt> *this,int i)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  uint uVar8;
  
  piVar4 = (this->heap).data;
  iVar3 = piVar4[i];
  if (i != 0) {
    piVar5 = (this->indices).data;
    pdVar6 = ((this->lt).activity)->data;
    dVar2 = pdVar6[iVar3];
    do {
      uVar8 = i - 1;
      iVar7 = (int)uVar8 >> 1;
      pdVar1 = pdVar6 + piVar4[iVar7];
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      piVar4[i] = piVar4[iVar7];
      piVar5[piVar4[iVar7]] = i;
      i = iVar7;
    } while (1 < uVar8);
  }
  piVar4[i] = iVar3;
  (this->indices).data[iVar3] = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }